

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O2

wstring * __thiscall
mjs::number_to_precision_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double x,int p)

{
  uint uVar1;
  int k_00;
  wchar_t wVar2;
  wstring *this_00;
  double m_00;
  wstring m;
  wstring local_c8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a8;
  double local_88;
  int k;
  uint local_68;
  undefined1 local_64 [20];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  wstring s;
  
  local_88 = x;
  if ((0x7fefffffffffffff < (ulong)ABS(x)) || (k_00 = (int)this, 0x14 < k_00 - 1U)) {
    __assert_fail("std::isfinite(x) && p >= 1 && p <= 21",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                  ,0xd9,"std::wstring mjs::number_to_precision(double, int)");
  }
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&s,L"",(allocator<wchar_t> *)&m);
  m_00 = local_88;
  if (local_88 < 0.0) {
    std::__cxx11::wstring::assign((wchar_t *)&s);
    m_00 = -local_88;
  }
  anon_unknown_1::do_ecvt((ecvt_result *)&k,m_00,k_00);
  m._M_dataplus._M_p = (pointer)&m.field_2;
  std::__cxx11::wstring::_M_construct<char*>((wstring *)&m,local_64,local_64 + k);
  uVar1 = local_68 - 1;
  if ((int)local_68 < -5 || k_00 < (int)local_68) {
    local_68 = uVar1;
    if ((1 < m._M_string_length) &&
       (std::__cxx11::wstring::insert(&m,m._M_dataplus._M_p + 1,0x2e), local_68 == 0)) {
      std::__cxx11::wstring::append((wchar_t *)&m);
      uVar1 = local_68;
      goto LAB_00143e27;
    }
    if ((int)local_68 < 1) {
      std::__cxx11::to_wstring(&local_c8,-local_68);
      std::operator+(&local_a8,L"e-",&local_c8);
      std::__cxx11::wstring::append((wstring *)&m);
    }
    else {
      std::__cxx11::to_wstring(&local_c8,local_68);
      std::operator+(&local_a8,L"e+",&local_c8);
      std::__cxx11::wstring::append((wstring *)&m);
    }
    std::__cxx11::wstring::~wstring((wstring *)&local_a8);
    this_00 = &local_c8;
  }
  else {
    if (local_68 == k_00) goto LAB_00143e27;
    if (0 < (int)local_68) {
      local_68 = uVar1;
      std::__cxx11::wstring::insert(&m,m._M_dataplus._M_p + (ulong)uVar1 + 1,0x2e);
      uVar1 = local_68;
      goto LAB_00143e27;
    }
    wVar2 = -local_68;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_68 = uVar1;
    std::__cxx11::wstring::_M_construct((ulong)&local_50,wVar2);
    std::operator+(&local_c8,L"0.",&local_50);
    std::operator+(&local_a8,&local_c8,&m);
    std::__cxx11::wstring::operator=((wstring *)&m,(wstring *)&local_a8);
    std::__cxx11::wstring::~wstring((wstring *)&local_a8);
    std::__cxx11::wstring::~wstring((wstring *)&local_c8);
    this_00 = &local_50;
  }
  std::__cxx11::wstring::~wstring((wstring *)this_00);
  uVar1 = local_68;
LAB_00143e27:
  local_68 = uVar1;
  std::operator+(__return_storage_ptr__,&s,&m);
  std::__cxx11::wstring::~wstring((wstring *)&m);
  std::__cxx11::wstring::~wstring((wstring *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_precision(double x, int p) {
    // HACK HACK
    assert(std::isfinite(x) && p >= 1 && p <= 21);
    std::wstring s = L"";
    if (x < 0) {
        s = L"-";
        x = -x;
    }

    auto [k, e, digits] = do_ecvt(x, p);
    std::wstring m = std::wstring{digits, digits+k};
    e--;
    if (e < -6 || e >= p) {
        if (m.size() > 1) {
            m.insert(m.begin() + 1, L'.');
        }
        if (e == 0) {
            m += L"e+0";
        } else if (e > 0) {
            m += L"e+" + std::to_wstring(e);
        } else {
            m += L"e-" + std::to_wstring(-e);
        }
    } else if (e == p - 1) {
    } else if (e >= 0) {
        m.insert(m.begin() + e + 1, L'.');
    } else {
        m = L"0." + std::wstring(-(e+1), L'0') + m;
    }

    return s + m;
}